

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ranges.h
# Opt level: O0

void __thiscall
fmt::v11::detail::format_tuple_element<fmt::v11::context>::operator()
          (format_tuple_element<fmt::v11::context> *this,formatter<int,_char,_void> *f,int *v)

{
  context *pcVar1;
  basic_string_view<char> s;
  iterator iVar2;
  basic_appender<char> bVar3;
  basic_appender<char> in_RDI;
  context *in_stack_00000018;
  int *in_stack_00000020;
  native_formatter<int,_char,_(fmt::v11::detail::type)1> *in_stack_00000028;
  char *in_stack_ffffffffffffffc0;
  
  if (0 < *(int *)&(in_RDI.container)->ptr_) {
    pcVar1 = (context *)(in_RDI.container)->size_;
    iVar2 = context::out((context *)(in_RDI.container)->size_);
    s.size_ = (size_t)iVar2.container;
    s.data_ = in_stack_ffffffffffffffc0;
    bVar3 = copy<char,char,fmt::v11::basic_appender<char>>(s,in_RDI);
    context::advance_to(pcVar1,(iterator)bVar3.container);
  }
  pcVar1 = (context *)(in_RDI.container)->size_;
  iVar2 = native_formatter<int,_char,_(fmt::v11::detail::type)1>::format<fmt::v11::context>
                    (in_stack_00000028,in_stack_00000020,in_stack_00000018);
  context::advance_to(pcVar1,iVar2);
  *(int *)&(in_RDI.container)->ptr_ = *(int *)&(in_RDI.container)->ptr_ + 1;
  return;
}

Assistant:

void operator()(const formatter<T, char_type>& f, const T& v) {
    if (i > 0) ctx.advance_to(detail::copy<char_type>(separator, ctx.out()));
    ctx.advance_to(f.format(v, ctx));
    ++i;
  }